

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O2

ssize_t peek_at_header(archive_read_filter *filter,int *pbits)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  size_t min;
  ssize_t avail;
  uint local_34;
  
  min = 10;
  pvVar5 = __archive_read_filter_ahead(filter,10,&avail);
  if (pvVar5 == (void *)0x0) {
    return 0;
  }
  if (avail == 0) {
    return 0;
  }
  iVar4 = bcmp(pvVar5,anon_var_dwarf_5cfe,3);
  if (iVar4 == 0) {
    bVar2 = *(byte *)((long)pvVar5 + 3);
    if (bVar2 < 0x20) {
      if ((bVar2 & 4) != 0) {
        pvVar5 = __archive_read_filter_ahead(filter,0xc,&avail);
        if (pvVar5 == (void *)0x0) {
          return 0;
        }
        min = (ulong)*(ushort *)((long)pvVar5 + 10) + 0xc;
      }
      bVar3 = bVar2 & 8;
      local_34 = (uint)bVar2;
      while (bVar3 != 0) {
        if ((avail <= (long)min) &&
           (pvVar5 = __archive_read_filter_ahead(filter,min + 1,&avail), pvVar5 == (void *)0x0)) {
          return 0;
        }
        bVar3 = *(byte *)((long)pvVar5 + min);
        min = min + 1;
      }
      if (0xf < (byte)local_34) {
        sVar6 = min;
        do {
          min = sVar6 + 1;
          if ((avail <= (long)sVar6) &&
             (pvVar5 = __archive_read_filter_ahead(filter,min,&avail), pvVar5 == (void *)0x0)) {
            return 0;
          }
          pcVar1 = (char *)((long)pvVar5 + sVar6);
          sVar6 = min;
        } while (*pcVar1 != '\0');
      }
      if ((local_34 & 2) != 0) {
        min = min + 2;
        pvVar5 = __archive_read_filter_ahead(filter,min,&avail);
        if (pvVar5 == (void *)0x0) {
          return 0;
        }
      }
      if (pbits != (int *)0x0) {
        *pbits = 0x1b;
        return min;
      }
      return min;
    }
  }
  return 0;
}

Assistant:

static ssize_t
peek_at_header(struct archive_read_filter *filter, int *pbits)
{
	const unsigned char *p;
	ssize_t avail, len;
	int bits = 0;
	int header_flags;

	/* Start by looking at the first ten bytes of the header, which
	 * is all fixed layout. */
	len = 10;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);
	/* We only support deflation- third byte must be 0x08. */
	if (memcmp(p, "\x1F\x8B\x08", 3) != 0)
		return (0);
	bits += 24;
	if ((p[3] & 0xE0)!= 0)	/* No reserved flags set. */
		return (0);
	bits += 3;
	header_flags = p[3];
	/* Bytes 4-7 are mod time. */
	/* Byte 8 is deflate flags. */
	/* XXXX TODO: return deflate flags back to consume_header for use
	   in initializing the decompressor. */
	/* Byte 9 is OS. */

	/* Optional extra data:  2 byte length plus variable body. */
	if (header_flags & 4) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
		len += ((int)p[len + 1] << 8) | (int)p[len];
		len += 2;
	}

	/* Null-terminated optional filename. */
	if (header_flags & 8) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Null-terminated optional comment. */
	if (header_flags & 16) {
		do {
			++len;
			if (avail < len)
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Optional header CRC */
	if ((header_flags & 2)) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
#if 0
	int hcrc = ((int)p[len + 1] << 8) | (int)p[len];
	int crc = /* XXX TODO: Compute header CRC. */;
	if (crc != hcrc)
		return (0);
	bits += 16;
#endif
		len += 2;
	}

	if (pbits != NULL)
		*pbits = bits;
	return (len);
}